

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  int iVar4;
  
  if (s->size_ != 0) {
    bVar1 = *s->data_;
    if ((bVar1 - 0x30 < 10) && ((bVar1 != 0x30 || s->size_ == 1 || (9 < (byte)s->data_[1] - 0x30))))
    {
      sVar3 = s->size_;
      if (sVar3 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        pbVar2 = (byte *)s->data_;
        do {
          sVar3 = sVar3 - 1;
          if (9 < *pbVar2 - 0x30) break;
          if (99999999 < iVar4) {
            return false;
          }
          iVar4 = (uint)*pbVar2 + iVar4 * 10 + -0x30;
          s->data_ = (const_pointer)(pbVar2 + 1);
          s->size_ = sVar3;
          pbVar2 = pbVar2 + 1;
        } while (sVar3 != 0);
      }
      *np = iVar4;
      return true;
    }
  }
  return false;
}

Assistant:

size_type size() const { return size_; }